

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.cc
# Opt level: O1

void __thiscall gutil::Exception::Exception(Exception *this,string *type,string *message)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  long lVar3;
  long *plVar4;
  size_type *psVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  *(undefined ***)this = &PTR__Exception_00111c40;
  pcVar2 = (type->_M_dataplus)._M_p;
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_38,pcVar2,pcVar2 + type->_M_string_length);
  std::__cxx11::string::append((char *)local_38);
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_38,(ulong)(message->_M_dataplus)._M_p);
  paVar1 = &(this->s).field_2;
  (this->s)._M_dataplus._M_p = (pointer)paVar1;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar5) {
    lVar3 = plVar4[3];
    paVar1->_M_allocated_capacity = *psVar5;
    *(long *)((long)&(this->s).field_2 + 8) = lVar3;
  }
  else {
    (this->s)._M_dataplus._M_p = (pointer)*plVar4;
    (this->s).field_2._M_allocated_capacity = *psVar5;
  }
  (this->s)._M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  return;
}

Assistant:

Exception::Exception(const std::string &type, const std::string &message): s(type+": "+message)
{
#if defined(DEBUG) && defined(__GNUC__)
  std::ostringstream os;
  void *ptr[64];
  int nptr=backtrace(ptr, 64);
  char **sym=backtrace_symbols(ptr, nptr);

  for (int i=1; i<nptr-1; i++)
  {
    os << sym[i] << "\n";
  }

  if (nptr > 1)
  {
    os << sym[nptr-1];
  }

  free(sym);

  bt=os.str();
#endif
}